

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O0

bool __thiscall QAbstractButton::event(QAbstractButton *this,QEvent *e)

{
  int iVar1;
  bool bVar2;
  Type TVar3;
  int iVar4;
  FocusPolicy FVar5;
  QAbstractButtonPrivate *this_00;
  QEvent *in_RSI;
  QWidget *in_RDI;
  FocusReason in_stack_0000000c;
  QShortcutEvent *se;
  QAbstractButtonPrivate *d;
  bool in_stack_00000033;
  WidgetAttribute in_stack_00000034;
  QWidget *in_stack_00000038;
  QEvent *in_stack_00000118;
  QWidget *in_stack_00000120;
  bool local_1;
  
  bVar2 = QWidget::isEnabled((QWidget *)0x5005f1);
  if ((bVar2) ||
     ((((TVar3 = QEvent::type(in_RSI), 3 < TVar3 - MouseButtonPress && (TVar3 != ContextMenu)) &&
       (TVar3 != TabletMove)) && ((1 < TVar3 - TabletPress && (2 < TVar3 - HoverEnter)))))) {
    TVar3 = QEvent::type(in_RSI);
    if (TVar3 == Shortcut) {
      this_00 = d_func((QAbstractButton *)0x50066e);
      iVar1 = this_00->shortcutId;
      iVar4 = QShortcutEvent::shortcutId((QShortcutEvent *)in_RSI);
      if (iVar1 == iVar4) {
        bVar2 = QShortcutEvent::isAmbiguous((QShortcutEvent *)in_RSI);
        if (bVar2) {
          FVar5 = QWidget::focusPolicy(in_RDI);
          if (FVar5 != NoFocus) {
            QWidget::setFocus((QWidget *)se,in_stack_0000000c);
          }
          QWidget::window((QWidget *)this_00);
          QWidget::setAttribute(in_stack_00000038,in_stack_00000034,in_stack_00000033);
        }
        else {
          bVar2 = QBasicTimer::isActive(&this_00->animateTimer);
          if (!bVar2) {
            animateClick((QAbstractButton *)in_RDI);
          }
        }
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = QWidget::event(in_stack_00000120,in_stack_00000118);
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool QAbstractButton::event(QEvent *e)
{
    // as opposed to other widgets, disabled buttons accept mouse
    // events. This avoids surprising click-through scenarios
    if (!isEnabled()) {
        switch(e->type()) {
        case QEvent::TabletPress:
        case QEvent::TabletRelease:
        case QEvent::TabletMove:
        case QEvent::MouseButtonPress:
        case QEvent::MouseButtonRelease:
        case QEvent::MouseButtonDblClick:
        case QEvent::MouseMove:
        case QEvent::HoverMove:
        case QEvent::HoverEnter:
        case QEvent::HoverLeave:
        case QEvent::ContextMenu:
            return true;
        default:
            break;
        }
    }

#ifndef QT_NO_SHORTCUT
    if (e->type() == QEvent::Shortcut) {
        Q_D(QAbstractButton);
        QShortcutEvent *se = static_cast<QShortcutEvent *>(e);
        if (d->shortcutId != se->shortcutId())
            return false;
        if (!se->isAmbiguous()) {
            if (!d->animateTimer.isActive())
                animateClick();
        } else {
            if (focusPolicy() != Qt::NoFocus)
                setFocus(Qt::ShortcutFocusReason);
            window()->setAttribute(Qt::WA_KeyboardFocusChange);
        }
        return true;
    }
#endif
    return QWidget::event(e);
}